

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::AdvancedResourcesMax::RunIteration(AdvancedResourcesMax *this,GLuint index)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  GLint GVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  GLuint GVar6;
  allocator_type local_51;
  GLuint data;
  undefined4 uStack_4c;
  pointer local_48;
  GLuint local_34;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar5 = 0;
  while (lVar5 != 8) {
    data = (GLuint)(lVar5 + 1);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,data - 1,this->m_storage_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&data,0x88e4);
    lVar5 = lVar5 + 1;
  }
  lVar5 = 0;
  while (lVar5 != 0xc) {
    data = (GLuint)(lVar5 + 1);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,data - 1,this->m_uniform_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,4,&data,0x88e4);
    lVar5 = lVar5 + 1;
  }
  lVar5 = 0;
  while (lVar5 != 8) {
    data = (GLuint)(lVar5 + 1);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,data - 1,this->m_atomic_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,&data,0x88e4);
    lVar5 = lVar5 + 1;
  }
  uVar4 = 0;
  local_34 = index;
  for (lVar5 = -0x10; lVar5 != 0; lVar5 = lVar5 + 1) {
    data = uVar4 + 1;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_texture[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,4,&data,0x88e9);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glActiveTexture(this_00,uVar4 | 0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_image_buffer[lVar5]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8236,this->m_texture[lVar5]);
    uVar4 = uVar4 + 1;
  }
  GVar6 = 0;
  for (lVar5 = -0x20; lVar5 != 0; lVar5 = lVar5 + 4) {
    data = GVar6 + 1;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,*(GLuint *)((long)this->m_image + lVar5));
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,4,&data,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture
              (this_00,0x8c2a,*(GLuint *)((long)this->m_image + lVar5 + 0x20));
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8236,*(GLuint *)((long)this->m_image + lVar5))
    ;
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindImageTexture
              (this_00,GVar6,*(GLuint *)((long)this->m_image + lVar5 + 0x20),0,'\0',0,35000,0x8236);
    GVar6 = GVar6 + 1;
  }
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index");
  GVar6 = local_34;
  glu::CallLogWrapper::glUniform1ui(this_00,GVar2,local_34);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&data,0x1e0,&local_51);
  uVar3 = 0;
  while (((ulong)((long)local_48 - CONCAT44(uStack_4c,data)) >> 2 & 0xffffffff) != uVar3) {
    *(int *)(CONCAT44(uStack_4c,data) + uVar3 * 4) = (int)(uVar3 + 1);
    uVar3 = uVar3 + 1;
  }
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uniform_def");
  glu::CallLogWrapper::glUniform1uiv
            (this_00,GVar2,(GLsizei)((ulong)((long)local_48 - (long)CONCAT44(uStack_4c,data)) >> 2),
             (GLuint *)CONCAT44(uStack_4c,data));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&data);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[GVar6]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
  GVar1 = data;
  uVar4 = GVar6 * 6 + 6;
  if (data != uVar4) {
    anon_unknown_0::Output("Data is %d should be %d.\n",(ulong)data,(ulong)uVar4);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  return GVar1 == uVar4;
}

Assistant:

bool RunIteration(GLuint index)
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 12; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, i, m_atomic_buffer[i]);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLuint data = i + 1;
			glBindBuffer(GL_TEXTURE_BUFFER, m_texture_buffer[i]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_READ);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);

			glActiveTexture(GL_TEXTURE0 + i);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[i]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_texture_buffer[i]);
		}
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBuffer(GL_TEXTURE_BUFFER, m_image_buffer[i]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_COPY);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);

			glBindTexture(GL_TEXTURE_BUFFER, m_image[i]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_image_buffer[i]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);

			glBindImageTexture(i, m_image[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32UI);
		}

		glUseProgram(m_program);
		glUniform1ui(glGetUniformLocation(m_program, "g_index"), index);
		/* uniform array */
		{
			std::vector<GLuint> data(480);
			for (GLuint i = 0; i < static_cast<GLuint>(data.size()); ++i)
				data[i]   = i + 1;
			glUniform1uiv(glGetUniformLocation(m_program, "g_uniform_def"), static_cast<GLsizei>(data.size()),
						  &data[0]);
		}
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool result = true;
		/* validate buffer */
		{
			GLuint data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[index]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);

			if (data != (index + 1) * 6)
			{
				Output("Data is %d should be %d.\n", data, (index + 1) * 6);
				result = false;
			}
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		return result;
	}